

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_global_segment_info(global_segment sec)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  void **ppvVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  void **ppvStack_58;
  char *pcStack_50;
  uint *puStack_48;
  code *pcStack_40;
  
  uVar7 = sec.global_segment_count;
  if (uVar7 != 0) {
    ppvVar4 = &((sec.global_segment_addr)->init_data).arg;
    uVar9 = 0;
    do {
      pcStack_40 = (code *)0x10349b;
      pcVar2 = val_type(*(byte *)(ppvVar4 + -2));
      bVar1 = *(byte *)((long)ppvVar4 + -0xf);
      pcStack_40 = (code *)0x1034ac;
      pcVar3 = val_type(*(byte *)(ppvVar4 + -2));
      uVar8 = 0x109863;
      uVar6 = uVar9 & 0xffffffff;
      pcStack_40 = (code *)0x1034c5;
      printf("  - global[%d]: %s mutable=%d - init %s=",uVar6,pcVar2,(ulong)bVar1,pcVar3);
      switch(*(undefined1 *)(ppvVar4 + -2)) {
      case 0x7c:
        uVar10 = (undefined4)**ppvVar4;
        goto LAB_00103518;
      case 0x7d:
        uVar10 = SUB84((double)**ppvVar4,0);
LAB_00103518:
        pcStack_40 = (code *)0x103526;
        printf("%f\n",uVar10);
        break;
      case 0x7e:
        pcStack_40 = (code *)0x1034f7;
        printf("%ld\n",**ppvVar4);
        break;
      case 0x7f:
        pcStack_40 = (code *)0x10350c;
        printf("%d\n",(ulong)**ppvVar4);
        break;
      default:
        pcStack_40 = print_export_segment_info;
        print_global_segment_info_cold_1();
        puStack_48 = &switchD_001034d8::switchdataD_001095bc;
        uStack_70 = 0x6d656d00000000;
        uStack_68 = 0x6c67000000000000;
        uStack_80 = 0x636e7566;
        uStack_78 = 0x656c6261740000;
        uStack_60 = 0x6c61626f;
        if (uVar8 != 0) {
          puVar5 = (uint *)(uVar6 + 0xc);
          uVar9 = 0;
          ppvStack_58 = ppvVar4;
          pcStack_50 = pcVar2;
          pcStack_40 = (code *)(ulong)uVar7;
          do {
            printf("  - export[%d]: %s[%d] -> %s\n",uVar9 & 0xffffffff,
                   (long)&uStack_80 + (ulong)(byte)puVar5[-1] * 10,(ulong)*puVar5,
                   *(undefined8 *)(puVar5 + -3));
            uVar9 = uVar9 + 1;
            puVar5 = puVar5 + 4;
          } while (uVar8 != uVar9);
        }
        return;
      }
      uVar9 = uVar9 + 1;
      ppvVar4 = ppvVar4 + 3;
    } while (uVar7 != uVar9);
  }
  return;
}

Assistant:

void print_global_segment_info(global_segment sec) {
    global_pointer global_segment_addr;
    for (int i = 0; i < sec.global_segment_count; ++i) {
        global_segment_addr = sec.global_segment_addr + i;
        printf("  - global[%d]: %s mutable=%d - init %s=", i, val_type(global_segment_addr->type.val_type),
               global_segment_addr->type.mut_type, val_type(global_segment_addr->type.val_type));
        switch (global_segment_addr->type.val_type) {
            case I32:
                printf("%d\n", *(int32 *) global_segment_addr->init_data.arg);
                break;
            case I64:
                printf("%ld\n", *(int64 *) global_segment_addr->init_data.arg);
                break;
            case F32:
                printf("%f\n", *(float32 *) global_segment_addr->init_data.arg);
                break;
            case F64:
                printf("%f\n", *(float64 *) global_segment_addr->init_data.arg);
                break;
            default:
                errorExit("\nwrong typeID\n");
        }
    }
}